

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::CZString::CZString(CZString *this,CZString *other)

{
  uint uVar1;
  char *value;
  uint uVar2;
  
  value = other->cstr_;
  if (((other->field_1).index_ & 3) != 0) {
    if (value == (char *)0x0) {
      value = (char *)0x0;
    }
    else {
      value = duplicateStringValue(value,(ulong)((other->field_1).index_ >> 2));
    }
  }
  this->cstr_ = value;
  uVar1 = (other->field_1).index_ & 3;
  uVar2 = (uint)(uVar1 != 0);
  if (other->cstr_ == (char *)0x0) {
    uVar2 = uVar1;
  }
  (this->field_1).index_ = (this->field_1).index_ & 0xfffffffc | uVar2;
  (this->field_1).index_ = (other->field_1).index_ & 0xfffffffc | uVar2;
  return;
}

Assistant:

Value::CZString::CZString(const CZString& other)
    : cstr_(other.storage_.policy_ != noDuplication && other.cstr_ != 0
                ? duplicateStringValue(other.cstr_, other.storage_.length_)
                : other.cstr_)
{
  storage_.policy_ = (other.cstr_
                 ? (other.storage_.policy_ == (unsigned int) noDuplication
                     ? (unsigned int) noDuplication : (unsigned int) duplicate)
                 : other.storage_.policy_);
  storage_.length_ = other.storage_.length_;
}